

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

secp256k1_scratch_space * secp256k1_scratch_space_create(secp256k1_context *ctx,size_t max_size)

{
  secp256k1_scratch_space *__s;
  
  __s = (secp256k1_scratch_space *)malloc(0x90);
  if (__s == (secp256k1_scratch_space *)0x0) {
    (*(ctx->error_callback).fn)("Out of memory",(ctx->error_callback).data);
  }
  else {
    memset(__s,0,0x90);
    __s->max_size = max_size;
    __s->error_callback = &ctx->error_callback;
  }
  return __s;
}

Assistant:

secp256k1_scratch_space* secp256k1_scratch_space_create(const secp256k1_context* ctx, size_t max_size) {
    VERIFY_CHECK(ctx != NULL);
    return secp256k1_scratch_create(&ctx->error_callback, max_size);
}